

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O2

S2Point * __thiscall
EncodedS2LaxPolygonShape::loop_vertex
          (S2Point *__return_storage_ptr__,EncodedS2LaxPolygonShape *this,int i,int j)

{
  int iVar1;
  uint uVar2;
  S2LogMessage local_30;
  
  if (i < *(int *)&(this->super_S2Shape).field_0xc) {
    iVar1 = num_loop_vertices(this,i);
    if (j < iVar1) {
      if (*(int *)&(this->super_S2Shape).field_0xc != 1) {
        uVar2 = s2coding::EncodedUintVector<unsigned_int>::operator[](&this->cumulative_vertices_,i)
        ;
        j = j + uVar2;
      }
      s2coding::EncodedS2PointVector::operator[](__return_storage_ptr__,&this->vertices_,j);
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x114,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: (j) < (num_loop_vertices(i)) ");
  }
  else {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0x113,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_30.stream_,"Check failed: (i) < (num_loops()) ");
  }
  abort();
}

Assistant:

S2Point EncodedS2LaxPolygonShape::loop_vertex(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  if (num_loops() == 1) {
    return vertices_[j];
  } else {
    return vertices_[cumulative_vertices_[i] + j];
  }
}